

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache.cpp
# Opt level: O2

int __thiscall bidfx_public_api::tools::NameCache::LastID(NameCache *this,string *name_prefix)

{
  iterator iVar1;
  _Rb_tree_color _Var2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->mutex_);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>_>
                  *)this,name_prefix);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->cache_)._M_t._M_impl.super__Rb_tree_header) {
    _Var2 = _S_red;
  }
  else {
    _Var2 = iVar1._M_node[2]._M_color;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return _Var2;
}

Assistant:

int NameCache::LastID(const std::string& name_prefix)
{
    std::unique_lock<std::mutex> lock(mutex_);
    auto existing = cache_.find(name_prefix);
    if (existing == cache_.end())
    {
        return 0;
    }
    return existing->second;
}